

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool basist::decoder_etc_block::unpack_color5
               (color32 *result,uint16_t packed_color5,uint16_t packed_delta3,bool scaled,
               uint32_t alpha)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = packed_delta3 >> 6 & 7;
  uVar5 = packed_delta3 >> 3 & 7;
  uVar1 = ((packed_color5 >> 10 & 0x1f) + uVar1 + (uint)(uVar1 < 4) * 8) - 8;
  uVar5 = (uVar5 + (uint)(uVar5 < 4) * 8 + (packed_color5 >> 5 & 0x1f)) - 8;
  uVar4 = ((packed_color5 & 0x1f) + (packed_delta3 & 7) + (uint)((packed_delta3 & 7) < 4) * 8) - 8;
  uVar2 = uVar5 | uVar4 | uVar1;
  if (0x1f < uVar2) {
    if (0x1e < (int)uVar1) {
      uVar1 = 0x1f;
    }
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    if (0x1e < (int)uVar5) {
      uVar5 = 0x1f;
    }
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    uVar6 = 0x1f;
    if ((int)uVar4 < 0x1f) {
      uVar6 = uVar4;
    }
    uVar4 = uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = 0;
    }
  }
  if (scaled) {
    uVar4 = uVar4 >> 2 | uVar4 * 8;
    uVar5 = (int)uVar5 >> 2 | uVar5 * 8;
    uVar1 = uVar1 >> 2 | uVar1 * 8;
  }
  uVar3 = 0xff;
  if (alpha < 0xff) {
    uVar3 = alpha;
  }
  (result->field_0).field_0.r = (uint8_t)uVar1;
  (result->field_0).field_0.g = (uint8_t)uVar5;
  (result->field_0).field_0.b = (uint8_t)uVar4;
  (result->field_0).field_0.a = (uint8_t)uVar3;
  return uVar2 < 0x20;
}

Assistant:

static void unpack_delta3(int& r, int& g, int& b, uint16_t packed_delta3)
		{
			r = (packed_delta3 >> 6) & 7;
			g = (packed_delta3 >> 3) & 7;
			b = packed_delta3 & 7;
			if (r >= 4) r -= 8;
			if (g >= 4) g -= 8;
			if (b >= 4) b -= 8;
		}